

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitview.h
# Opt level: O0

word_type __thiscall
bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>::get
          (bitview<bv::internal::bitarray_t<4096UL>::array> *this,size_t begin,size_t end)

{
  const_reference pvVar1;
  ulong uVar2;
  size_type __n;
  byte bVar3;
  ulong in_RDX;
  ulong in_RSI;
  array<unsigned_long,_64UL> *in_RDI;
  size_t lo_shift;
  word_type hi_val;
  size_t hi_shift;
  size_t hi_index;
  size_t lo_index;
  size_type in_stack_ffffffffffffffa8;
  undefined8 local_8;
  
  bVar3 = -(char)in_RDX - 0x40;
  pvVar1 = std::array<unsigned_long,_64UL>::operator[](in_RDI,in_stack_ffffffffffffffa8);
  uVar2 = (*pvVar1 << (bVar3 & 0x3f)) >> (bVar3 & 0x3f);
  bVar3 = (byte)in_RSI & 0x3f;
  if (in_RSI >> 6 < in_RDX - (in_RDX != 0) >> 6) {
    __n = uVar2 << (0x40 - bVar3 & 0x3f);
    pvVar1 = std::array<unsigned_long,_64UL>::operator[](in_RDI,__n);
    local_8 = __n | *pvVar1 >> ((byte)in_RSI & 0x3f);
  }
  else {
    local_8 = (uVar2 >> bVar3) * (ulong)(in_RSI < in_RDX);
  }
  return local_8;
}

Assistant:

bitview_base::word_type
        bitview<C>::get(size_t begin, size_t end) const
        {
            static constexpr size_t bits = bitsize<word_type>();
            static constexpr size_t mask = ~ size_t(0) / bits * bits;
            
            // everything above has been computed at compile time.
            // Now do some work:
            
            // the index in the container of
            // the lower or higher item needed
            size_t lo_index = (begin          ) / bits;
            size_t hi_index = (end - (end > 0)) / bits;
            
            // we read container[hi_adr] first and possibly delete
            // the highest bits:
            size_t hi_shift = size_t(mask - end) % bits;
            word_type hi_val = _container[hi_index] << hi_shift >> hi_shift;
            
            // if all bits are in the same item,
            // we delete the lower bits and are done:
            size_t lo_shift = begin % bits;
            if ( hi_index <= lo_index )
                return (hi_val >> lo_shift) * (begin < end);
            
            // else we have to read the lower item as well, and combine both
            return ( hi_val << (bits - lo_shift)    |
                     _container[lo_index] >> lo_shift );
            
        }